

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<ConstantsTest,_testing::internal::TemplateSel<ConstantsTest_Values_Test>,_testing::internal::Types1<double>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  bool bVar1;
  char *value_param;
  SetUpTestCaseFunc set_up_tc;
  TypeId fixture_class_id;
  String *this;
  uint in_ECX;
  char *pcVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  TestFactoryImpl<ConstantsTest_Values_Test<double>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  String *this_00;
  char *in_stack_ffffffffffffffa0;
  TearDownTestCaseFunc in_stack_ffffffffffffffb0;
  TestFactoryBase *in_stack_ffffffffffffffb8;
  String local_40;
  String local_30;
  uint local_1c;
  char *local_18;
  char *local_10;
  char *local_8;
  
  pcVar2 = "/";
  if (*in_RDI == '\0') {
    pcVar2 = "";
  }
  this_00 = &local_30;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  String::Format((char *)this_00,"%s%s%s/%d",in_RDI,pcVar2,in_RSI,(ulong)in_ECX);
  pcVar2 = String::c_str(this_00);
  GetPrefixUntilComma(in_stack_ffffffffffffff68);
  value_param = String::c_str(&local_40);
  GetTypeName<double>();
  set_up_tc = (SetUpTestCaseFunc)String::c_str((String *)&stack0xffffffffffffffa0);
  fixture_class_id = GetTypeId<ConstantsTest<double>>();
  this = (String *)operator_new(8);
  TestFactoryImpl<ConstantsTest_Values_Test<double>_>::TestFactoryImpl(in_stack_ffffffffffffff60);
  MakeAndRegisterTestInfo
            (in_stack_ffffffffffffffa0,pcVar2,(char *)this_00,value_param,fixture_class_id,set_up_tc
             ,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  String::~String(this);
  String::~String(this);
  String::~String(this);
  bVar1 = TypeParameterizedTest<ConstantsTest,_testing::internal::TemplateSel<ConstantsTest_Values_Test>,_testing::internal::Types0>
          ::Register(local_8,local_10,local_18,local_1c + 1);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        String::Format("%s%s%s/%d", prefix, prefix[0] == '\0' ? "" : "/",
                       case_name, index).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }